

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.cpp
# Opt level: O0

void __thiscall
ruckig::BrakeProfile::get_position_brake_trajectory
          (BrakeProfile *this,double v0,double a0,double vMax,double vMin,double aMax,double aMin,
          double jMax)

{
  reference pvVar1;
  double dVar2;
  double jMax_local;
  double aMin_local;
  double aMax_local;
  double vMin_local;
  double vMax_local;
  double a0_local;
  double v0_local;
  BrakeProfile *this_local;
  
  pvVar1 = std::array<double,_2UL>::operator[](&this->t,0);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->t,1);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->j,0);
  *pvVar1 = 0.0;
  pvVar1 = std::array<double,_2UL>::operator[](&this->j,1);
  *pvVar1 = 0.0;
  if ((((jMax != 0.0) || (NAN(jMax))) && ((aMax != 0.0 || (NAN(aMax))))) &&
     ((aMin != 0.0 || (NAN(aMin))))) {
    if (aMax < a0) {
      acceleration_brake(this,v0,a0,vMax,vMin,aMax,aMin,jMax);
    }
    else if (aMin <= a0) {
      if (((vMax < v0) && (dVar2 = v_at_a_zero(v0,a0,-jMax), vMin < dVar2)) ||
         ((0.0 < a0 && (dVar2 = v_at_a_zero(v0,a0,jMax), vMax < dVar2)))) {
        velocity_brake(this,v0,a0,vMax,vMin,aMax,aMin,jMax);
      }
      else if (((v0 < vMin) && (dVar2 = v_at_a_zero(v0,a0,jMax), dVar2 < vMax)) ||
              ((a0 < 0.0 && (dVar2 = v_at_a_zero(v0,a0,-jMax), dVar2 < vMin)))) {
        velocity_brake(this,v0,a0,vMin,vMax,aMin,aMax,-jMax);
      }
    }
    else {
      acceleration_brake(this,v0,a0,vMin,vMax,aMin,aMax,-jMax);
    }
  }
  return;
}

Assistant:

void BrakeProfile::get_position_brake_trajectory(double v0, double a0, double vMax, double vMin, double aMax, double aMin, double jMax) {
    t[0] = 0.0;
    t[1] = 0.0;
    j[0] = 0.0;
    j[1] = 0.0;

    if (jMax == 0.0 || aMax == 0.0 || aMin == 0.0) {
        return; // Ignore braking for zero-limits
    }

    if (a0 > aMax) {
        acceleration_brake(v0, a0, vMax, vMin, aMax, aMin, jMax);

    } else if (a0 < aMin) {
        acceleration_brake(v0, a0, vMin, vMax, aMin, aMax, -jMax);

    } else if ((v0 > vMax && v_at_a_zero(v0, a0, -jMax) > vMin) || (a0 > 0 && v_at_a_zero(v0, a0, jMax) > vMax)) {
        velocity_brake(v0, a0, vMax, vMin, aMax, aMin, jMax);

    } else if ((v0 < vMin && v_at_a_zero(v0, a0, jMax) < vMax) || (a0 < 0 && v_at_a_zero(v0, a0, -jMax) < vMin)) {
        velocity_brake(v0, a0, vMin, vMax, aMin, aMax, -jMax);
    }
}